

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

sim_result * analyzeConflict(Abc_Ntk_t *pNtk,int *pModel,int fVerbose)

{
  int *piVar1;
  int iVar2;
  int n;
  uint uVar3;
  sim_result *psVar4;
  int *piVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int numins;
  int numouts;
  sim_result *cex;
  int *pValues;
  int count;
  int i;
  Abc_Obj_t *pNode;
  int fVerbose_local;
  int *pModel_local;
  Abc_Ntk_t *pNtk_local;
  
  pValues._0_4_ = 0;
  iVar2 = Abc_NtkPoNum(pNtk);
  n = Abc_NtkPiNum(pNtk);
  psVar4 = (sim_result *)malloc(0x20);
  piVar5 = ints(n);
  psVar4->inVec = piVar5;
  piVar5 = ints(iVar2);
  psVar4->outVec = piVar5;
  piVar5 = Abc_NtkVerifySimulatePattern(pNtk,pModel);
  for (pValues._4_4_ = 0; iVar2 = Abc_NtkCiNum(pNtk), pValues._4_4_ < iVar2;
      pValues._4_4_ = pValues._4_4_ + 1) {
    pAVar6 = Abc_NtkCi(pNtk,pValues._4_4_);
    iVar2 = pModel[pValues._4_4_];
    piVar1 = psVar4->inVec;
    uVar3 = Abc_ObjId(pAVar6);
    piVar1[uVar3 - 1] = iVar2;
  }
  for (pValues._4_4_ = 0; iVar2 = Abc_NtkCoNum(pNtk), pValues._4_4_ < iVar2;
      pValues._4_4_ = pValues._4_4_ + 1) {
    pAVar6 = Abc_NtkCo(pNtk,pValues._4_4_);
    iVar2 = piVar5[pValues._4_4_];
    piVar1 = psVar4->outVec;
    uVar3 = Abc_ObjId(pAVar6);
    piVar1[(uVar3 - n) - 1] = iVar2;
    if (piVar5[pValues._4_4_] != 0) {
      pValues._0_4_ = (int)pValues + 1;
    }
  }
  psVar4->outVecOnes = (int)pValues;
  psVar4->activity = 0.0;
  if (fVerbose != 0) {
    for (pValues._4_4_ = 0; iVar2 = Abc_NtkCiNum(pNtk), pValues._4_4_ < iVar2;
        pValues._4_4_ = pValues._4_4_ + 1) {
      pAVar6 = Abc_NtkCi(pNtk,pValues._4_4_);
      pcVar7 = Abc_ObjName(pAVar6);
      printf(" %s=%d",pcVar7,(ulong)(uint)pModel[pValues._4_4_]);
    }
    printf("\n");
  }
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  return psVar4;
}

Assistant:

static struct sim_result *
analyzeConflict( Abc_Ntk_t * pNtk, int * pModel, int fVerbose )
{   
    Abc_Obj_t * pNode;
    int i, count = 0;
    int * pValues;
    struct sim_result * cex;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);
    
    cex = ABC_ALLOC(struct sim_result, 1);  
    cex->inVec = ints( numins );
    cex->outVec =  ints( numouts ); 

    /* get the CO values under this model */
    pValues = Abc_NtkVerifySimulatePattern( pNtk, pModel );    

    Abc_NtkForEachCi( pNtk, pNode, i ) 
        cex->inVec[Abc_ObjId(pNode)-1] = pModel[i];
    Abc_NtkForEachCo( pNtk, pNode, i ) {
        cex->outVec[Abc_ObjId(pNode)-numins-1] = pValues[i];
        if (pValues[i]) count++;
    }   
    
    cex->outVecOnes = count;
    cex->activity = 0;  

    if (fVerbose) {
        Abc_NtkForEachCi( pNtk, pNode, i )
            printf(" %s=%d", Abc_ObjName(pNode), pModel[i]);
        printf("\n");
    }

    ABC_FREE( pValues );    

    return cex;
}